

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O1

void av1_block_yrd(MACROBLOCK *x,RD_STATS *this_rdc,int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int16_t *piVar4;
  int16_t *piVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  undefined7 in_register_00000009;
  int16_t *piVar10;
  int16_t *piVar11;
  ulong uVar12;
  intptr_t iVar13;
  int iVar14;
  tran_low_t *ptVar15;
  undefined7 in_register_00000081;
  uint uVar16;
  MACROBLOCK *pMVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  uint16_t eob [1];
  tran_low_t qcoeff_buf [256];
  tran_low_t coeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  int16_t *piVar21;
  int16_t *piVar22;
  int16_t *piVar23;
  ushort local_d42;
  uint local_d40;
  uint local_d3c;
  int local_d38;
  uint local_d34;
  tran_low_t *local_d30;
  ulong local_d28;
  int local_d1c;
  ulong local_d18;
  ulong local_d10;
  uint8_t *local_d08;
  RD_STATS *local_d00;
  int local_cf8;
  int local_cf4;
  long local_cf0;
  SCAN_ORDER (*local_ce8) [16];
  ulong local_ce0;
  long local_cd8;
  long local_cd0;
  MACROBLOCK *local_cc8;
  long local_cc0;
  long local_cb8;
  ulong local_cb0;
  uint local_ca4;
  ulong local_ca0;
  ulong local_c98;
  uint *local_c90;
  int64_t local_c88;
  int local_c80 [256];
  tran_low_t local_880 [256];
  tran_low_t local_480 [276];
  
  local_ce0 = CONCAT71(in_register_00000081,tx_size);
  uVar12 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar12];
  local_d10 = (ulong)bVar8;
  iVar1 = (int)local_ce0 * 2;
  bVar7 = (byte)iVar1;
  local_cf4 = 1 << (bVar7 & 0x1f);
  local_d38 = 1 << (tx_size & 0x1f);
  iVar14 = (x->e_mbd).mb_to_right_edge;
  iVar19 = (x->e_mbd).mb_to_bottom_edge;
  local_d40 = iVar19 >> 0x1f & iVar19 >> 5;
  local_cf0 = CONCAT44(local_cf0._4_4_,iVar1);
  local_cf8 = (int)((uint)bVar8 << (bVar7 & 0x1f)) >> (tx_size & 0x1f);
  bVar7 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar12];
  local_cd8 = (long)(iVar14 >> 0x1f & iVar14 >> 5);
  local_d34 = ((x->e_mbd).cur_buf)->flags;
  uVar16 = (uint)bVar8 * 4;
  uVar12 = (ulong)uVar16;
  iVar14 = (uint)bVar7 * 4;
  local_cb0 = uVar12;
  local_c90 = (uint *)skippable;
  if ((local_d34 & 8) == 0) {
    (*aom_subtract_block)
              (iVar14,uVar16,x->plane[0].src_diff,uVar12,x->plane[0].src.buf,
               (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
               (long)(x->e_mbd).plane[0].dst.stride);
  }
  else {
    aom_highbd_subtract_block_sse2
              (iVar14,uVar16,x->plane[0].src_diff,uVar12,x->plane[0].src.buf,
               (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
               (long)(x->e_mbd).plane[0].dst.stride);
  }
  local_cd8 = local_cd8 + local_d10;
  local_d40 = local_d40 + bVar7;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  bVar20 = true;
  if (((byte)local_ce0 == 1) && ((0x3affe0UL >> ((ulong)bsize & 0x3f) & 1) != 0)) {
    bVar20 = (0x3dfffaUL >> ((ulong)bsize & 0x3f) & 1) == 0;
  }
  bVar8 = (byte)((local_d34 & 8) >> 3) | bVar20;
  local_ca4 = (uint)bVar8;
  local_cd0 = (long)local_d38;
  local_ca0 = (ulong)local_d40;
  local_d00 = this_rdc;
  local_cc8 = x;
  local_c98 = uVar12;
  if ((bVar8 == 0) && (0 < (int)local_d40)) {
    iVar19 = (int)local_d10;
    iVar14 = (int)local_cd8;
    if (iVar19 < (int)local_cd8) {
      iVar14 = iVar19;
    }
    local_d3c = 2 << ((byte)local_cf0 & 0x1f);
    iVar1 = 2 << ((byte)local_ce0 & 0x1f);
    local_cb8 = (long)iVar1;
    local_ce8 = (SCAN_ORDER (*) [16])CONCAT44(local_ce8._4_4_,iVar14);
    local_d08 = (uint8_t *)(long)iVar14;
    local_d1c = local_d38 * iVar19 * 0x10;
    uVar12 = 0;
    lVar18 = 0;
    iVar14 = 0;
    local_d18 = CONCAT44(local_d18._4_4_,iVar1 * 4);
    local_d30 = (tran_low_t *)CONCAT44(local_d30._4_4_,local_d3c << 4);
    do {
      local_d28 = uVar12;
      local_cc0 = lVar18;
      if (0 < (int)local_ce8) {
        iVar19 = iVar14 << 4;
        lVar18 = 0;
        do {
          (*aom_hadamard_lp_8x8_dual)
                    (local_cc8->plane[0].src_diff + (int)uVar12,local_cb0,
                     (int16_t *)((long)iVar19 * 2 + (long)local_cc8->plane[0].coeff));
          lVar18 = lVar18 + local_cb8;
          uVar12 = (ulong)(uint)((int)uVar12 + (int)local_d18);
          iVar14 = iVar14 + local_d3c;
          iVar19 = iVar19 + (int)local_d30;
        } while (lVar18 < (long)local_d08);
      }
      lVar18 = local_cc0 + local_cd0;
      uVar12 = (ulong)(uint)((int)local_d28 + local_d1c);
    } while (lVar18 < (long)local_ca0);
  }
  if ((int)local_d40 < 1) {
    local_d3c = 1;
    iVar14 = 0;
  }
  else {
    local_cc0 = CONCAT44(local_cc0._4_4_,(uint)(byte)local_ce0);
    local_ce8 = av1_scan_orders + (local_ce0 & 0xff);
    local_d08 = (local_cc8->txfm_search_info).blk_skip;
    local_d18 = (ulong)(uint)(0x10 << ((byte)local_cf0 & 0x1f));
    local_cf0 = (local_d10 & 0xffffffff) * local_cd0;
    local_d38 = local_d38 * (int)local_d10 * 0x10;
    local_cb8 = CONCAT44(local_cb8._4_4_,(int)local_cd0 * 4);
    local_cf8 = local_cf8 << 4;
    local_cf4 = local_cf4 << 4;
    local_d3c = 1;
    local_d30 = local_880;
    iVar19 = 0;
    iVar1 = 0;
    local_d10 = 0;
    iVar14 = 0;
    uVar12 = local_cb0;
    pMVar17 = local_cc8;
    do {
      local_d40 = iVar1;
      local_d1c = iVar19;
      if (0 < (int)local_cd8) {
        local_d3c = local_d3c & 1;
        lVar18 = 0;
        do {
          ptVar15 = local_d30;
          piVar10 = pMVar17->plane[0].src_diff + iVar1;
          if ((byte)local_ce0 == '\x01') {
            if ((local_d34 & 8) != 0) {
              aom_hadamard_8x8_sse2(piVar10,uVar12,local_880);
              piVar10 = pMVar17->plane[0].zbin_QTX;
              piVar11 = pMVar17->plane[0].quant_fp_QTX;
              piVar5 = pMVar17->plane[0].round_fp_QTX;
              piVar23 = pMVar17->plane[0].quant_shift_QTX;
              iVar13 = 0x40;
              piVar22 = av1_default_iscan_8x8_transpose;
              piVar4 = default_scan_8x8_transpose;
              goto LAB_00221c01;
            }
            if ((local_ca4 & 1) == 0) {
              ptVar15 = (tran_low_t *)((long)iVar19 * 2 + (long)pMVar17->plane[0].coeff);
            }
            else {
              local_d28 = CONCAT44(local_d28._4_4_,iVar14);
              aom_hadamard_lp_8x8_sse2(piVar10,uVar12,(int16_t *)local_d30);
              iVar14 = (int)local_d28;
            }
            piVar10 = pMVar17->plane[0].quant_fp_QTX;
            piVar11 = pMVar17->plane[0].round_fp_QTX;
            iVar13 = 0x40;
            piVar23 = av1_default_iscan_8x8_transpose;
            piVar5 = default_scan_8x8_transpose;
            local_d30 = ptVar15;
LAB_00221de4:
            piVar4 = pMVar17->plane[0].dequant_QTX;
LAB_00221df3:
            (*av1_quantize_lp)((int16_t *)ptVar15,iVar13,piVar11,piVar10,(int16_t *)local_c80,
                               (int16_t *)local_480,piVar4,&local_d42,piVar5,piVar23);
          }
          else {
            if ((int)local_cc0 == 2) {
              if ((local_d34 & 8) == 0) {
                local_d28 = CONCAT44(local_d28._4_4_,iVar14);
                (*aom_hadamard_lp_16x16)(piVar10,uVar12,(int16_t *)local_d30);
                piVar10 = pMVar17->plane[0].quant_fp_QTX;
                piVar11 = pMVar17->plane[0].round_fp_QTX;
                iVar13 = 0x100;
                piVar23 = av1_default_iscan_lp_16x16_transpose;
                piVar5 = default_scan_lp_16x16_transpose;
                iVar14 = (int)local_d28;
                goto LAB_00221de4;
              }
              (*aom_hadamard_16x16)(piVar10,uVar12,local_880);
              piVar10 = pMVar17->plane[0].zbin_QTX;
              piVar11 = pMVar17->plane[0].quant_fp_QTX;
              piVar5 = pMVar17->plane[0].round_fp_QTX;
              piVar23 = pMVar17->plane[0].quant_shift_QTX;
              iVar13 = 0x100;
              piVar22 = av1_default_iscan_fp_16x16_transpose;
              piVar4 = default_scan_fp_16x16_transpose;
LAB_00221c01:
              piVar21 = pMVar17->plane[0].dequant_QTX;
            }
            else {
              if ((local_d34 & 8) == 0) {
                local_d28 = CONCAT44(local_d28._4_4_,iVar14);
                aom_fdct4x4_lp_sse2(piVar10,(int16_t *)local_d30,(int)local_c98);
                piVar10 = pMVar17->plane[0].quant_fp_QTX;
                piVar11 = pMVar17->plane[0].round_fp_QTX;
                piVar4 = pMVar17->plane[0].dequant_QTX;
                piVar5 = (*local_ce8)[0].scan;
                piVar23 = (*local_ce8)[0].iscan;
                iVar13 = 0x10;
                iVar14 = (int)local_d28;
                goto LAB_00221df3;
              }
              aom_fdct4x4_sse2(piVar10,local_880,(int)local_c98);
              piVar10 = pMVar17->plane[0].zbin_QTX;
              piVar11 = pMVar17->plane[0].quant_fp_QTX;
              piVar5 = pMVar17->plane[0].round_fp_QTX;
              piVar23 = pMVar17->plane[0].quant_shift_QTX;
              piVar21 = pMVar17->plane[0].dequant_QTX;
              piVar4 = (*local_ce8)[0].scan;
              piVar22 = (*local_ce8)[0].iscan;
              iVar13 = 0x10;
            }
            (*av1_quantize_fp)(local_880,iVar13,piVar10,piVar5,piVar11,piVar23,local_c80,local_480,
                               piVar21,&local_d42,piVar4,piVar22);
          }
          bVar20 = local_d42 == 0;
          if (!bVar20) {
            local_d3c = 0;
          }
          uVar16 = (uint)local_d42;
          if ((local_d34 & 8) == 0) {
            local_d08[lVar18] = bVar20;
            if (local_d42 != 0) {
              if (uVar16 == 1) {
                uVar9 = -(ushort)local_c80[0];
                if (0 < (short)(ushort)local_c80[0]) {
                  uVar9 = (ushort)local_c80[0];
                }
                uVar3 = (uint)uVar9;
              }
              else {
                uVar3 = (*aom_satd_lp)((int16_t *)local_c80,(int)local_d18);
              }
              local_d00->rate = local_d00->rate + uVar3;
            }
            lVar6 = (*av1_block_error_lp)((int16_t *)local_d30,(int16_t *)local_480,local_d18);
          }
          else {
            local_d08[lVar18] = bVar20;
            if (uVar16 != 0) {
              if (local_d42 == 1) {
                iVar2 = -local_c80[0];
                if (0 < local_c80[0]) {
                  iVar2 = local_c80[0];
                }
              }
              else {
                iVar2 = (*aom_satd)(local_c80,(int)local_d18);
              }
              local_d00->rate = local_d00->rate + iVar2;
            }
            lVar6 = (*av1_highbd_block_error)
                              (local_880,local_480,local_d18,&local_c88,(local_cc8->e_mbd).bd);
          }
          local_d00->dist = local_d00->dist + (lVar6 >> 2);
          iVar2 = 0x1f;
          if (uVar16 + 1 != 0) {
            for (; uVar16 + 1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          iVar14 = iVar14 + iVar2;
          lVar18 = lVar18 + local_cd0;
          iVar1 = iVar1 + (int)local_cb8;
          iVar19 = iVar19 + local_cf4;
          uVar12 = local_cb0;
          pMVar17 = local_cc8;
        } while (lVar18 < local_cd8);
      }
      local_d10 = local_d10 + local_cd0;
      local_d08 = local_d08 + local_cf0;
      iVar1 = local_d40 + local_d38;
      iVar19 = local_d1c + local_cf8;
    } while ((long)local_d10 < (long)local_ca0);
    iVar14 = iVar14 << 9;
  }
  *local_c90 = local_d3c;
  local_d00->skip_txfm = (uint8_t)local_d3c;
  if (local_d00->sse != 0x7fffffffffffffff) {
    lVar18 = (local_d00->sse << 6) >> 2;
    local_d00->sse = lVar18;
    if (local_d3c != 0) {
      local_d00->dist = lVar18;
      return;
    }
  }
  local_d00->rate = local_d00->rate * 0x800 + iVar14;
  return;
}

Assistant:

void av1_block_yrd(MACROBLOCK *x, RD_STATS *this_rdc, int *skippable,
                   BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblockd_plane *pd = &xd->plane[AOM_PLANE_Y];
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int row_step = step * num_4x4_w >> tx_size;
  int block = 0;
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int use_hbd = is_cur_buf_hbd(xd);
  int num_blk_skip_w = num_4x4_w;

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    aom_highbd_subtract_block(bh, bw, p->src_diff, bw, p->src.buf,
                              p->src.stride, pd->dst.buf, pd->dst.stride);
  } else {
    aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                       pd->dst.buf, pd->dst.stride);
  }
#else
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pd->dst.buf, pd->dst.stride);
#endif

  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  // For block sizes 8x16 or above, Hadamard txfm of two adjacent 8x8 blocks
  // can be done per function call. Hence the call of Hadamard txfm is
  // abstracted here for the specified cases.
  int is_tx_8x8_dual_applicable =
      (tx_size == TX_8X8 && block_size_wide[bsize] >= 16 &&
       block_size_high[bsize] >= 8);

#if CONFIG_AV1_HIGHBITDEPTH
  // As of now, dual implementation of hadamard txfm is available for low
  // bitdepth.
  if (use_hbd) is_tx_8x8_dual_applicable = 0;
#endif

  if (is_tx_8x8_dual_applicable) {
    aom_process_hadamard_lp_8x16(x, max_blocks_high, max_blocks_wide, num_4x4_w,
                                 step, block_step);
  }

  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
#if CONFIG_AV1_HIGHBITDEPTH
  DECLARE_BLOCK_YRD_HBD_VARS()
#else
  (void)use_hbd;
#endif

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()

      switch (tx_size) {
#if CONFIG_AV1_HIGHBITDEPTH
        case TX_16X16:
          if (use_hbd) {
            aom_hadamard_16x16(src_diff, diff_stride, coeff);
            av1_quantize_fp(coeff, 16 * 16, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob,
                            // default_scan_fp_16x16_transpose and
                            // av1_default_iscan_fp_16x16_transpose have to be
                            // used together.
                            default_scan_fp_16x16_transpose,
                            av1_default_iscan_fp_16x16_transpose);
          } else {
            aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
            av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX,
                            p->quant_fp_QTX, low_qcoeff, low_dqcoeff,
                            p->dequant_QTX, eob,
                            // default_scan_lp_16x16_transpose and
                            // av1_default_iscan_lp_16x16_transpose have to be
                            // used together.
                            default_scan_lp_16x16_transpose,
                            av1_default_iscan_lp_16x16_transpose);
          }
          break;
        case TX_8X8:
          if (use_hbd) {
            aom_hadamard_8x8(src_diff, diff_stride, coeff);
            av1_quantize_fp(
                coeff, 8 * 8, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
                p->quant_shift_QTX, qcoeff, dqcoeff, p->dequant_QTX, eob,
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          } else {
            if (is_tx_8x8_dual_applicable) {
              // The coeffs are pre-computed for the whole block, so re-assign
              // low_coeff to the appropriate location.
              const int block_offset = BLOCK_OFFSET(block + s);
              low_coeff = (int16_t *)p->coeff + block_offset;
            } else {
              aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
            }
            av1_quantize_lp(
                low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX, low_qcoeff,
                low_dqcoeff, p->dequant_QTX, eob,
                // default_scan_8x8_transpose and
                // av1_default_iscan_8x8_transpose have to be used together.
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          }
          break;
        default:
          assert(tx_size == TX_4X4);
          // In tx_size=4x4 case, aom_fdct4x4 and aom_fdct4x4_lp generate
          // normal coefficients order, so we don't need to change the scan
          // order here.
          if (use_hbd) {
            aom_fdct4x4(src_diff, coeff, diff_stride);
            av1_quantize_fp(coeff, 4 * 4, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob, scan_order->scan,
                            scan_order->iscan);
          } else {
            aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
            av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                            low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                            scan_order->scan, scan_order->iscan);
          }
          break;
#else
        case TX_16X16:
          aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
          av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_lp_16x16_transpose,
                          av1_default_iscan_lp_16x16_transpose);
          break;
        case TX_8X8:
          if (is_tx_8x8_dual_applicable) {
            // The coeffs are pre-computed for the whole block, so re-assign
            // low_coeff to the appropriate location.
            const int block_offset = BLOCK_OFFSET(block + s);
            low_coeff = (int16_t *)p->coeff + block_offset;
          } else {
            aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
          }
          av1_quantize_lp(low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_8x8_transpose,
                          av1_default_iscan_8x8_transpose);
          break;
        default:
          aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
          av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          scan_order->scan, scan_order->iscan);
          break;
#endif
      }
      assert(*eob <= 1024);
#if CONFIG_AV1_HIGHBITDEPTH
      if (use_hbd)
        update_yrd_loop_vars_hbd(x, &temp_skippable, step, *eob, coeff, qcoeff,
                                 dqcoeff, this_rdc, &eob_cost,
                                 r * num_blk_skip_w + c);
      else
#endif
        update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                             low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                             r * num_blk_skip_w + c);
    }
    block += row_step;
  }

  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }

  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}